

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GetVectorLen
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  GenReceiver(this,struct_def,code_ptr);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&local_a0,&this->namer_,field);
  std::operator+(&local_c0,&local_a0,"Length(self)");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  if ((((this->super_BaseGenerator).parser_)->opts).python_typing == true) {
    std::__cxx11::string::append((char *)code_ptr);
  }
  std::__cxx11::string::append((char *)code_ptr);
  if ((field->value).type.base_type == BASE_TYPE_ARRAY) {
    GenIndents_abi_cxx11_(&local_40,this,2);
    std::operator+(&local_60,&local_40,"return ");
    NumToString<unsigned_short>(&local_80,(field->value).type.fixed_length);
    std::operator+(&local_a0,&local_60,&local_80);
    std::operator+(&local_c0,&local_a0,"\n\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    this_00 = &local_40;
  }
  else {
    OffsetPrefix_abi_cxx11_(&local_c0,this,field,false);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_c0);
    GenIndents_abi_cxx11_(&local_a0,this,3);
    std::operator+(&local_c0,&local_a0,"return self._tab.VectorLen(o)");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
    GenIndents_abi_cxx11_(&local_a0,this,2);
    std::operator+(&local_c0,&local_a0,"return 0\n\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_c0);
    this_00 = &local_a0;
  }
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void GetVectorLen(const StructDef &struct_def, const FieldDef &field,
                    std::string *code_ptr) const {
    auto &code = *code_ptr;

    GenReceiver(struct_def, code_ptr);
    code += namer_.Method(field) + "Length(self)";
    if (parser_.opts.python_typing) { code += " -> int"; }
    code += ":";
    if (!IsArray(field.value.type)) {
      code += OffsetPrefix(field, false);
      code += GenIndents(3) + "return self._tab.VectorLen(o)";
      code += GenIndents(2) + "return 0\n\n";
    } else {
      code += GenIndents(2) + "return " +
              NumToString(field.value.type.fixed_length) + "\n\n";
    }
  }